

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInsertsOnePass
          (DeadInsertElimPass *this,Function *func)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  Op OVar1;
  DefUseManager *this_01;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  uint32_t uVar5;
  int32_t iVar6;
  uint32_t after;
  Instruction *pIVar7;
  BasicBlock *pBVar8;
  __node_base_ptr p_Var9;
  ulong uVar10;
  IRContext *pIVar11;
  uint uVar12;
  __node_base_ptr p_Var13;
  pointer puVar14;
  bool bVar15;
  __hashtable *__h;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_instructions;
  undefined1 local_88 [8];
  Instruction *pIStack_80;
  Instruction *local_78;
  _Any_data local_68;
  __uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> local_58;
  code *pcStack_50;
  Function *local_40;
  uint32_t local_34;
  
  this_00 = &this->liveInserts_;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->visitedPhis_)._M_h);
  puVar14 = (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = func;
  if (puVar14 !=
      (func->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      for (local_88 = *(undefined1 (*) [8])
                       ((long)&(((puVar14->_M_t).
                                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                _M_head_impl)->insts_).
                               super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
          local_88 !=
          (undefined1  [8])
          ((long)&(((puVar14->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->insts_
                  ).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          local_88 = (undefined1  [8])
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88)->next_node_) {
        OVar1 = ((Instruction *)local_88)->opcode_;
        pIVar11 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar11->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar11);
        }
        this_01 = (pIVar11->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        uVar5 = 0;
        if (*(bool *)((long)local_88 + 0x2c) == true) {
          uVar5 = Instruction::GetSingleWordOperand((Instruction *)local_88,0);
        }
        pIVar7 = analysis::DefUseManager::GetDef(this_01,uVar5);
        if (OVar1 == OpCompositeInsert) {
          if (pIVar7->opcode_ != OpTypeArray) goto LAB_001ef73c;
          uVar5 = 0;
          if (*(bool *)((long)local_88 + 0x2d) == true) {
            uVar5 = Instruction::GetSingleWordOperand
                              ((Instruction *)local_88,(uint)*(bool *)((long)local_88 + 0x2c));
          }
          local_68._M_unused._0_8_ = (undefined8)this_00;
          local_34 = uVar5;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_00,&local_34,&local_68);
        }
        else if ((OVar1 == OpPhi) && (iVar6 = spvOpcodeIsComposite(pIVar7->opcode_), iVar6 != 0)) {
LAB_001ef73c:
          uVar5 = 0;
          if (*(bool *)((long)local_88 + 0x2d) == true) {
            uVar5 = Instruction::GetSingleWordOperand
                              ((Instruction *)local_88,(uint)*(bool *)((long)local_88 + 0x2c));
          }
          pIVar11 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar11->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar11);
          }
          pcStack_50 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:195:42)>
                       ::_M_invoke;
          local_58._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
               (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
               std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:195:42)>
               ::_M_manager;
          local_68._M_unused._M_object = (IRContext *)local_88;
          local_68._8_8_ = this;
          analysis::DefUseManager::ForEachUser
                    ((pIVar11->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,uVar5,(function<void_(spvtools::opt::Instruction_*)> *)&local_68);
          if ((_Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               )local_58._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl != (Module *)0x0
             ) {
            (*(code *)local_58._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)
                      (&local_68,&local_68,__destroy_functor);
          }
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 !=
             (local_40->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_88 = (undefined1  [8])0x0;
  pIStack_80 = (Instruction *)0x0;
  local_78 = (Instruction *)0x0;
  puVar14 = (local_40->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (puVar14 ==
      (local_40->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar15 = false;
  }
  else {
    bVar15 = false;
    do {
      pBVar8 = (puVar14->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      for (pIVar11 = *(IRContext **)
                      ((long)&(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x10);
          pIVar11 !=
          (IRContext *)&(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar11 = *(IRContext **)&(pIVar11->grammar_).target_env_) {
        if (pIVar11->unique_id_ == OpCompositeInsert) {
          uVar10 = 0;
          if ((bool)pIVar11->field_0x2d == true) {
            uVar5 = Instruction::GetSingleWordOperand
                              ((Instruction *)pIVar11,(uint)(byte)pIVar11->field_0x2c);
            uVar10 = (ulong)uVar5;
          }
          uVar5 = (uint32_t)uVar10;
          uVar2 = (this->liveInserts_)._M_h._M_bucket_count;
          uVar10 = uVar10 % uVar2;
          p_Var3 = (this->liveInserts_)._M_h._M_buckets[uVar10];
          p_Var9 = (__node_base_ptr)0x0;
          if ((p_Var3 != (__node_base_ptr)0x0) &&
             (p_Var9 = p_Var3, p_Var13 = p_Var3->_M_nxt,
             uVar5 != *(uint32_t *)&p_Var3->_M_nxt[1]._M_nxt)) {
            while (p_Var4 = p_Var13->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var9 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar10) ||
                 (p_Var9 = p_Var13, p_Var13 = p_Var4, uVar5 == *(uint *)&p_Var4[1]._M_nxt))
              goto LAB_001ef8ab;
            }
            p_Var9 = (__node_base_ptr)0x0;
          }
LAB_001ef8ab:
          if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
            uVar12 = ((byte)pIVar11->field_0x2d & 1) + 1;
            if ((bool)pIVar11->field_0x2c == false) {
              uVar12 = (uint)(byte)pIVar11->field_0x2d;
            }
            after = Instruction::GetSingleWordOperand((Instruction *)pIVar11,uVar12 + 1);
            IRContext::ReplaceAllUsesWith((this->super_MemPass).super_Pass.context_,uVar5,after);
            local_68._M_unused._0_8_ = (undefined8)pIVar11;
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            emplace_back<spvtools::opt::Instruction*>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)local_88,(Instruction **)&local_68);
            bVar15 = true;
          }
        }
        pBVar8 = (puVar14->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 !=
             (local_40->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_88 != (undefined1  [8])pIStack_80) {
    do {
      pIVar7 = pIStack_80 + -1;
      pIStack_80 = (Instruction *)&pIStack_80[-1].dbg_scope_;
      local_68._8_8_ = (DeadInsertElimPass *)0x0;
      pcStack_50 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:241:19)>
                   ::_M_invoke;
      local_58._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
      super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
           std::
           _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:241:19)>
           ::_M_manager;
      local_68._M_unused._M_object = (IRContext *)local_88;
      MemPass::DCEInst(&this->super_MemPass,(Instruction *)pIVar7->dbg_scope_,
                       (function<void_(spvtools::opt::Instruction_*)> *)&local_68);
      if ((_Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
          local_58._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl != (Module *)0x0) {
        (*(code *)local_58._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)
                  (&local_68,&local_68,__destroy_functor);
      }
    } while (local_88 != (undefined1  [8])pIStack_80);
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,(long)local_78 - (long)local_88);
  }
  return bVar15;
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInsertsOnePass(Function* func) {
  bool modified = false;
  liveInserts_.clear();
  visitedPhis_.clear();
  // Mark all live inserts
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      // Only process Inserts and composite Phis
      spv::Op op = ii->opcode();
      Instruction* typeInst = get_def_use_mgr()->GetDef(ii->type_id());
      if (op != spv::Op::OpCompositeInsert &&
          (op != spv::Op::OpPhi || !spvOpcodeIsComposite(typeInst->opcode())))
        continue;
      // The marking algorithm can be expensive for large arrays and the
      // efficacy of eliminating dead inserts into arrays is questionable.
      // Skip optimizing array inserts for now. Just mark them live.
      // TODO(greg-lunarg): Eliminate dead array inserts
      if (op == spv::Op::OpCompositeInsert) {
        if (typeInst->opcode() == spv::Op::OpTypeArray) {
          liveInserts_.insert(ii->result_id());
          continue;
        }
      }
      const uint32_t id = ii->result_id();
      get_def_use_mgr()->ForEachUser(id, [&ii, this](Instruction* user) {
        if (user->IsCommonDebugInstr()) return;
        switch (user->opcode()) {
          case spv::Op::OpCompositeInsert:
          case spv::Op::OpPhi:
            // Use by insert or phi does not initiate marking
            break;
          case spv::Op::OpCompositeExtract: {
            // Capture extract indices
            std::vector<uint32_t> extIndices;
            uint32_t icnt = 0;
            user->ForEachInOperand([&icnt, &extIndices](const uint32_t* idp) {
              if (icnt > 0) extIndices.push_back(*idp);
              ++icnt;
            });
            // Mark all inserts in chain that intersect with extract
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, &extIndices, 0, &visited_phis);
          } break;
          default: {
            // Mark inserts in chain for all components
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, nullptr, 0, &visited_phis);
          } break;
        }
      });
    }
  }
  // Find and disconnect dead inserts
  std::vector<Instruction*> dead_instructions;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      if (ii->opcode() != spv::Op::OpCompositeInsert) continue;
      const uint32_t id = ii->result_id();
      if (liveInserts_.find(id) != liveInserts_.end()) continue;
      const uint32_t replId =
          ii->GetSingleWordInOperand(kInsertCompositeIdInIdx);
      (void)context()->ReplaceAllUsesWith(id, replId);
      dead_instructions.push_back(&*ii);
      modified = true;
    }
  }
  // DCE dead inserts
  while (!dead_instructions.empty()) {
    Instruction* inst = dead_instructions.back();
    dead_instructions.pop_back();
    DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
      auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                         other_inst);
      if (i != dead_instructions.end()) {
        dead_instructions.erase(i);
      }
    });
  }
  return modified;
}